

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O1

bool __thiscall
QXmlStreamReaderPrivate::referenceEntity
          (QXmlStreamReaderPrivate *this,QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *hash,
          Entity *entity)

{
  qsizetype qVar1;
  char16_t *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  QEntityReference *pQVar7;
  uint *puVar8;
  long lVar9;
  char *sourceText;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((entity->field_0x30 & 0x10) == 0) {
    qVar1 = (entity->name).d.size;
    iVar5 = ((int)(entity->value).d.size - (int)qVar1) + this->entityLength + -2;
    this->entityLength = iVar5;
    if (this->entityExpansionLimit < iVar5) {
      sourceText = "Entity expands to more characters than the entity expansion limit.";
      goto LAB_003a69c3;
    }
    entity->field_0x30 = entity->field_0x30 | 0x10;
    pcVar2 = (entity->name).d.ptr;
    lVar9 = (this->entityReferenceStack).tos;
    lVar3 = (this->entityReferenceStack).cap;
    if (lVar3 <= lVar9 + 1) {
      lVar9 = lVar9 + 2;
      lVar6 = lVar3 * 2;
      if (lVar9 != lVar6 && SBORROW8(lVar9,lVar6) == lVar9 + lVar3 * -2 < 0) {
        lVar6 = lVar9;
      }
      (this->entityReferenceStack).cap = lVar6;
      pQVar7 = (QEntityReference *)realloc((this->entityReferenceStack).data,lVar6 * 0x18);
      (this->entityReferenceStack).data = pQVar7;
      if (pQVar7 != (QEntityReference *)0x0) goto LAB_003a6a7e;
LAB_003a6b37:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
      goto LAB_003a6b4c;
    }
LAB_003a6a7e:
    pQVar7 = (this->entityReferenceStack).data;
    lVar9 = (this->entityReferenceStack).tos + 1;
    (this->entityReferenceStack).tos = lVar9;
    pQVar7[lVar9].name.m_size = 0;
    pQVar7[lVar9].name.m_data = (storage_type_conflict *)0x0;
    pQVar7[lVar9].hash = hash;
    pQVar7[lVar9].name.m_size = qVar1;
    pQVar7[lVar9].name.m_data = pcVar2;
    lVar9 = (this->putStack).tos;
    lVar3 = (this->putStack).cap;
    if (lVar3 <= lVar9 + 1) {
      lVar9 = lVar9 + 2;
      lVar6 = lVar3 * 2;
      if (lVar9 != lVar6 && SBORROW8(lVar9,lVar6) == lVar9 + lVar3 * -2 < 0) {
        lVar6 = lVar9;
      }
      (this->putStack).cap = lVar6;
      puVar8 = (uint *)realloc((this->putStack).data,lVar6 << 2);
      (this->putStack).data = puVar8;
      if (puVar8 == (uint *)0x0) goto LAB_003a6b37;
    }
    lVar9 = (this->putStack).tos;
    (this->putStack).tos = lVar9 + 1;
    (this->putStack).data[lVar9 + 1] = 0x2d0000;
    bVar4 = true;
  }
  else {
    sourceText = "Self-referencing entity detected.";
LAB_003a69c3:
    QCoreApplication::translate(&local_40,"QXmlStream",sourceText,(char *)0x0,-1);
    this->error = NotWellFormedError;
    QString::operator=(&this->errorString,&local_40);
    this->type = Invalid;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
LAB_003a6b4c:
  __stack_chk_fail();
}

Assistant:

inline bool referenceEntity(QHash<QStringView, Entity> *hash, Entity &entity)
    {
        Q_ASSERT(hash);
        if (entity.isCurrentlyReferenced) {
            raiseWellFormedError(QXmlStream::tr("Self-referencing entity detected."));
            return false;
        }
        // entityLength represents the amount of additional characters the
        // entity expands into (can be negative for e.g. &amp;). It's used to
        // avoid DoS attacks through recursive entity expansions
        entityLength += entity.value.size() - entity.name.size() - 2;
        if (entityLength > entityExpansionLimit) {
            raiseWellFormedError(QXmlStream::tr("Entity expands to more characters than the entity expansion limit."));
            return false;
        }
        entity.isCurrentlyReferenced = true;
        entityReferenceStack.push() = { hash, entity.name };
        injectToken(ENTITY_DONE);
        return true;
    }